

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_json.c
# Opt level: O0

gravity_value_t JSON_value(gravity_vm *vm,json_value *json)

{
  uint32_t n;
  size_t sVar1;
  gravity_value_t *pgVar2;
  gravity_value_t gVar3;
  char *local_68;
  gravity_class_t *local_58;
  gravity_value_t value;
  uint i;
  gravity_list_t *list;
  uint length;
  gravity_object_t *obj;
  json_value *json_local;
  gravity_vm *vm_local;
  gravity_value_t objv;
  
  switch(json->type) {
  case json_none:
  case json_null:
    objv.isa = (gravity_class_t *)0x0;
    vm_local = (gravity_vm *)gravity_class_null;
    break;
  case json_object:
    objv.isa = gravity_object_deserialize(vm,json);
    if (objv.isa == (gravity_object_t *)0x0) {
      objv.isa = (gravity_class_t *)0x0;
      vm_local = (gravity_vm *)gravity_class_null;
    }
    else {
      vm_local = (gravity_vm *)(objv.isa)->isa;
    }
    break;
  case json_array:
    n = (json->u).string.length;
    objv.isa = (gravity_class_t *)gravity_list_new(vm,n);
    for (value.field_1.n._4_4_ = 0; (uint)value.field_1.n._4_4_ < n;
        value.field_1.n._4_4_ = value.field_1.n._4_4_ + 1) {
      gVar3 = JSON_value(vm,*(json_value **)
                             ((json->u).string.ptr + (ulong)(uint)value.field_1.n._4_4_ * 8));
      if ((char *)((gravity_value_r *)&(objv.isa)->objclass)->n == (objv.isa)->identifier) {
        if ((objv.isa)->identifier == (char *)0x0) {
          local_68 = (char *)0x8;
        }
        else {
          local_68 = (char *)((long)(objv.isa)->identifier << 1);
        }
        (objv.isa)->identifier = local_68;
        pgVar2 = (gravity_value_t *)
                 realloc(*(gravity_value_t **)&(objv.isa)->has_outer,
                         (long)(objv.isa)->identifier << 4);
        *(gravity_value_t **)&(objv.isa)->has_outer = pgVar2;
      }
      pgVar2 = *(gravity_value_t **)&(objv.isa)->has_outer;
      sVar1 = ((gravity_value_r *)&(objv.isa)->objclass)->n;
      ((gravity_value_r *)&(objv.isa)->objclass)->n = sVar1 + 1;
      local_58 = gVar3.isa;
      pgVar2[sVar1].isa = local_58;
      value.isa = (gravity_class_t *)gVar3.field_1;
      pgVar2[sVar1].field_1.p = value.isa;
    }
    vm_local = (gravity_vm *)(objv.isa)->isa;
    break;
  case json_integer:
    objv.isa = (gravity_class_t *)(json->u).integer;
    vm_local = (gravity_vm *)gravity_class_int;
    break;
  case json_double:
    objv.isa = (gravity_class_t *)(json->u).integer;
    vm_local = (gravity_vm *)gravity_class_float;
    break;
  case json_string:
    _vm_local = gravity_string_to_value(vm,(json->u).string.ptr,(json->u).string.length);
    break;
  case json_boolean:
    objv.isa = (gravity_class_t *)(long)(json->u).boolean;
    vm_local = (gravity_vm *)gravity_class_bool;
    break;
  default:
    objv.isa = (gravity_class_t *)0x0;
    vm_local = (gravity_vm *)gravity_class_null;
  }
  return _vm_local;
}

Assistant:

static gravity_value_t JSON_value (gravity_vm *vm, json_value *json) {
    switch (json->type) {
        case json_none:
        case json_null:
            return VALUE_FROM_NULL;
            
        case json_object: {
            gravity_object_t *obj = gravity_object_deserialize(vm, json);
            gravity_value_t objv = (obj) ? VALUE_FROM_OBJECT(obj) : VALUE_FROM_NULL;
            return objv;
        }
            
        case json_array: {
            unsigned int length = json->u.array.length;
            gravity_list_t *list = gravity_list_new(vm, length);
            for (unsigned int i = 0; i < length; ++i) {
                gravity_value_t value = JSON_value(vm, json->u.array.values[i]);
                marray_push(gravity_value_t, list->array, value);
            }
            return VALUE_FROM_OBJECT(list);
        }
            
        case json_integer:
            return VALUE_FROM_INT(json->u.integer);
            
        case json_double:
            return VALUE_FROM_FLOAT(json->u.dbl);
            
        case json_string:
            return VALUE_FROM_STRING(vm, json->u.string.ptr, json->u.string.length);
            
        case json_boolean:
            return VALUE_FROM_BOOL(json->u.boolean);
    }
    
    return VALUE_FROM_NULL;
}